

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool anon_unknown.dwarf_13fc48::DecompressPiz
               (uchar *outPtr,uint *outSize,uchar *inPtr,size_t tmpBufSize,
               vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *channelInfo,int dataWidth,int numLines)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  unsigned_short *puVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  size_type __n;
  ChannelInfo *pCVar8;
  const_reference pvVar9;
  reference pvVar10;
  PIZChannelData *pPVar11;
  int n;
  PIZChannelData *cd_1;
  size_t i_2;
  int y;
  int j;
  PIZChannelData *cd;
  size_t i_1;
  int pixelSize;
  ChannelInfo *chan;
  size_t i;
  unsigned_short *tmpBufferEnd;
  undefined1 auStack_220a8 [8];
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  channelData;
  allocator<unsigned_short> aStack_22079;
  undefined1 auStack_22078 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  int length;
  unsigned_short maxValue;
  unsigned_short lut [65536];
  uchar *ptr;
  uchar local_2048 [4];
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  uchar bitmap [8192];
  int dataWidth_local;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *channelInfo_local;
  size_t tmpBufSize_local;
  uchar *inPtr_local;
  uint *outSize_local;
  uchar *outPtr_local;
  
  bVar5 = IsBigEndian();
  if (!bVar5) {
    memset(local_2048,0,0x2000);
    uVar1 = *(ushort *)inPtr;
    uVar2 = *(ushort *)(inPtr + 2);
    lut._131064_8_ = inPtr + 4;
    if (uVar2 < 0x2000) {
      if (uVar1 <= uVar2) {
        memcpy(local_2048 + (int)(uint)uVar1,(void *)lut._131064_8_,
               (long)(int)(((uint)uVar2 - (uint)uVar1) + 1));
        lut._131064_8_ = lut._131064_8_ + (long)(int)(((uint)uVar2 - (uint)uVar1) + 1);
      }
      memset(&length,0,0x20000);
      tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_2_ =
           reverseLutFromBitmap(local_2048,(unsigned_short *)&length);
      tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = *(int *)lut._131064_8_;
      std::allocator<unsigned_short>::allocator(&aStack_22079);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)auStack_22078,tmpBufSize
                 ,&aStack_22079);
      std::allocator<unsigned_short>::~allocator(&aStack_22079);
      iVar6 = (int)tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)auStack_22078,0
                         );
      channelInfo_local._0_4_ = (int)tmpBufSize;
      hufUncompress((char *)(lut._131064_8_ + 4),iVar6,pvVar7,(int)channelInfo_local);
      __n = std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::size(channelInfo);
      std::allocator<(anonymous_namespace)::PIZChannelData>::allocator
                ((allocator<(anonymous_namespace)::PIZChannelData> *)((long)&tmpBufferEnd + 7));
      std::
      vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
      ::vector((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                *)auStack_220a8,__n,
               (allocator<(anonymous_namespace)::PIZChannelData> *)((long)&tmpBufferEnd + 7));
      std::allocator<(anonymous_namespace)::PIZChannelData>::~allocator
                ((allocator<(anonymous_namespace)::PIZChannelData> *)((long)&tmpBufferEnd + 7));
      i = (size_t)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             auStack_22078,0);
      chan = (ChannelInfo *)0x0;
      while( true ) {
        pCVar8 = (ChannelInfo *)
                 std::
                 vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 ::size(channelInfo);
        if (pCVar8 <= chan) break;
        pvVar9 = std::
                 vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 ::operator[](channelInfo,(size_type)chan);
        i_1._4_4_ = 4;
        if (pvVar9->pixelType == 1) {
          i_1._4_4_ = 2;
        }
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        pvVar10->start = (unsigned_short *)i;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        puVar4 = pvVar10->start;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        pvVar10->end = puVar4;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        pvVar10->nx = dataWidth;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        pvVar10->ny = numLines;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        pvVar10->size = (int)((ulong)(long)i_1._4_4_ >> 1);
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        iVar6 = pvVar10->nx;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        iVar3 = pvVar10->ny;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)chan);
        i = i + (long)(iVar6 * iVar3 * pvVar10->size) * 2;
        chan = (ChannelInfo *)&(chan->name).field_0x1;
      }
      cd = (PIZChannelData *)0x0;
      while( true ) {
        pPVar11 = (PIZChannelData *)
                  std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::size((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                          *)auStack_220a8);
        if (pPVar11 <= cd) break;
        pvVar10 = std::
                  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                  ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                *)auStack_220a8,(size_type)cd);
        for (i_2._4_4_ = 0; i_2._4_4_ < pvVar10->size; i_2._4_4_ = i_2._4_4_ + 1) {
          wav2Decode(pvVar10->start + i_2._4_4_,pvVar10->nx,pvVar10->size,pvVar10->ny,
                     pvVar10->nx * pvVar10->size,
                     tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
        }
        cd = (PIZChannelData *)((long)&cd->start + 1);
      }
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)auStack_22078,0
                         );
      applyLut((unsigned_short *)&length,pvVar7,(int)channelInfo_local);
      outSize_local = (uint *)outPtr;
      for (i_2._0_4_ = 0; (int)i_2 < numLines; i_2._0_4_ = (int)i_2 + 1) {
        cd_1 = (PIZChannelData *)0x0;
        while( true ) {
          pPVar11 = (PIZChannelData *)
                    std::
                    vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                    ::size((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                            *)auStack_220a8);
          if (pPVar11 <= cd_1) break;
          pvVar10 = std::
                    vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                    ::operator[]((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                                  *)auStack_220a8,(size_type)cd_1);
          iVar6 = pvVar10->nx * pvVar10->size;
          memcpy(outSize_local,pvVar10->end,(long)iVar6 << 1);
          outSize_local = (uint *)((long)iVar6 * 2 + (long)outSize_local);
          pvVar10->end = pvVar10->end + iVar6;
          cd_1 = (PIZChannelData *)((long)&cd_1->start + 1);
        }
      }
      outPtr_local._7_1_ = true;
      std::
      vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
      ::~vector((vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 *)auStack_220a8);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)auStack_22078);
    }
    else {
      outPtr_local._7_1_ = false;
    }
    return outPtr_local._7_1_;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                ,0x2161,
                "bool (anonymous namespace)::DecompressPiz(unsigned char *, unsigned int &, const unsigned char *, size_t, const std::vector<ChannelInfo> &, int, int)"
               );
}

Assistant:

bool DecompressPiz(unsigned char *outPtr, unsigned int &outSize,
                   const unsigned char *inPtr, size_t tmpBufSize,
                   const std::vector<ChannelInfo> &channelInfo, int dataWidth,
                   int numLines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

  if (IsBigEndian()) {
    // @todo { PIZ compression on BigEndian architecture. }
    assert(0);
    return false;
  }

  memset(bitmap, 0, BITMAP_SIZE);

  const unsigned char *ptr = inPtr;
  minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  if (minNonZero <= maxNonZero) {
    memcpy((char *)&bitmap[0] + minNonZero, ptr, maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
  }

  unsigned short lut[USHORT_RANGE];
  memset(lut, 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap, lut);

  //
  // Huffman decoding
  //

  int length;

  length = *(reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  std::vector<unsigned short> tmpBuffer(tmpBufSize);
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer.at(0),
                tmpBufSize);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(channelInfo.size());

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < channelInfo.size(); ++i) {
    const ChannelInfo &chan = channelInfo[i];

    int pixelSize = sizeof(int); // UINT and FLOAT
    if (chan.pixelType == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = dataWidth;
    channelData[i].ny = numLines;
    // channelData[i].ys = 1;
    channelData[i].size = pixelSize / sizeof(short);

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut, &tmpBuffer.at(0), tmpBufSize);

  // @todo { Xdr }

  for (int y = 0; y < numLines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(outPtr, cd.end, n * sizeof(unsigned short));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}